

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::Server::Server(Server *this)

{
  anon_class_1_0_00000001 local_9;
  
  this->_vptr_Server = (_func_int **)&PTR__Server_001a05a0;
  *(undefined8 *)&(this->new_task_queue).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->new_task_queue).super__Function_base._M_functor + 8) = 0;
  (this->new_task_queue).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->new_task_queue)._M_invoker = (_Invoker_type)0x0;
  this->keep_alive_max_count_ = 5;
  this->read_timeout_sec_ = 5;
  this->read_timeout_usec_ = 0;
  this->payload_max_length_ = 0xffffffffffffffff;
  (this->is_running_)._M_base._M_i = false;
  (this->svr_sock_).super___atomic_base<int>._M_i = -1;
  memset(&this->base_dirs_,0,0x150);
  signal(0xd,(__sighandler_t)0x1);
  std::function<httplib::TaskQueue*()>::operator=
            ((function<httplib::TaskQueue*()> *)&this->new_task_queue,&local_9);
  return;
}

Assistant:

inline Server::Server()
    : keep_alive_max_count_(CPPHTTPLIB_KEEPALIVE_MAX_COUNT),
      read_timeout_sec_(CPPHTTPLIB_READ_TIMEOUT_SECOND),
      read_timeout_usec_(CPPHTTPLIB_READ_TIMEOUT_USECOND),
      payload_max_length_(CPPHTTPLIB_PAYLOAD_MAX_LENGTH), is_running_(false),
      svr_sock_(INVALID_SOCKET) {
#ifndef _WIN32
  signal(SIGPIPE, SIG_IGN);
#endif
  new_task_queue = [] {
#if CPPHTTPLIB_THREAD_POOL_COUNT > 0
    return new ThreadPool(CPPHTTPLIB_THREAD_POOL_COUNT);
#elif CPPHTTPLIB_THREAD_POOL_COUNT == 0
    return new Threads();
#else
    return new NoThread();
#endif
  };
}